

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ParseableFunctionInfo *
Js::ParseableFunctionInfo::New
          (ScriptContext *scriptContext,int nestedCount,LocalFunctionId functionId,
          Utf8SourceInfo *sourceInfo,char16 *displayName,uint displayNameLength,
          uint displayShortNameOffset,Attributes attributes,FunctionBodyFlags flags)

{
  code *pcVar1;
  uint uVar2;
  char16 *pcVar3;
  bool bVar4;
  uint uVar5;
  charcount_t cVar6;
  undefined4 *puVar7;
  ThreadContext *this;
  SourceContextInfo *pSVar8;
  Recycler *pRVar9;
  ParseableFunctionInfo *this_00;
  TrackAllocData local_68;
  uint local_40;
  uint local_3c;
  uint newFunctionNumber;
  uint displayNameLength_local;
  char16 *displayName_local;
  Utf8SourceInfo *sourceInfo_local;
  LocalFunctionId functionId_local;
  int nestedCount_local;
  ScriptContext *scriptContext_local;
  
  local_3c = displayNameLength;
  _newFunctionNumber = displayName;
  displayName_local = (char16 *)sourceInfo;
  sourceInfo_local._0_4_ = functionId;
  sourceInfo_local._4_4_ = nestedCount;
  _functionId_local = scriptContext;
  if ((scriptContext->DeferredParsingThunk != ScriptContext::ProfileModeDeferredParsingThunk) &&
     (scriptContext->DeferredParsingThunk != JavascriptFunction::DeferredParsingThunk)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x6d4,
                                "(scriptContext->DeferredParsingThunk == Js::ScriptContext::ProfileModeDeferredParsingThunk || scriptContext->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,
                                "scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk || scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this = ScriptContext::GetThreadContext(_functionId_local);
  local_40 = ThreadContext::NewFunctionNumber(this);
  pSVar8 = Utf8SourceInfo::GetSourceContextInfo((Utf8SourceInfo *)displayName_local);
  bVar4 = SourceContextInfo::IsDynamic(pSVar8);
  if (bVar4) {
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,DeferParsePhase);
    pcVar3 = _newFunctionNumber;
    uVar2 = local_40;
    if (bVar4) {
      uVar5 = Utf8SourceInfo::GetSourceInfoId((Utf8SourceInfo *)displayName_local);
      cVar6 = Utf8SourceInfo::GetCchLength((Utf8SourceInfo *)displayName_local);
      Output::Print(L"Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d;\n"
                    ,(ulong)uVar2,pcVar3,(ulong)uVar5,(ulong)cVar6);
      Output::Flush();
    }
  }
  else {
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,DeferParsePhase);
    pcVar3 = _newFunctionNumber;
    uVar2 = local_40;
    if (bVar4) {
      uVar5 = Utf8SourceInfo::GetSourceInfoId((Utf8SourceInfo *)displayName_local);
      cVar6 = Utf8SourceInfo::GetCchLength((Utf8SourceInfo *)displayName_local);
      pSVar8 = Utf8SourceInfo::GetSourceContextInfo((Utf8SourceInfo *)displayName_local);
      Output::Print(L"Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d; Source Url:%s\n"
                    ,(ulong)uVar2,pcVar3,(ulong)uVar5,(ulong)cVar6,(pSVar8->field_5).field_0.url);
      Output::Flush();
    }
  }
  pRVar9 = ScriptContext::GetRecycler(_functionId_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x6f3);
  pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_68);
  this_00 = (ParseableFunctionInfo *)new<Memory::Recycler>(0xb8,pRVar9,0xa35d90);
  ParseableFunctionInfo
            (this_00,_functionId_local->DeferredParsingThunk,sourceInfo_local._4_4_,
             (LocalFunctionId)sourceInfo_local,(Utf8SourceInfo *)displayName_local,_functionId_local
             ,local_40,_newFunctionNumber,local_3c,displayShortNameOffset,attributes | DeferredParse
             ,flags);
  return this_00;
}

Assistant:

ParseableFunctionInfo* ParseableFunctionInfo::New(ScriptContext* scriptContext, int nestedCount,
        LocalFunctionId functionId, Utf8SourceInfo* sourceInfo, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, FunctionInfo::Attributes attributes, FunctionBodyFlags flags)
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        Assert(
            scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk ||
            scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#else
        Assert(scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#endif

#ifdef PERF_COUNTERS
        PERF_COUNTER_INC(Code, DeferredFunction);
#endif
        uint newFunctionNumber = scriptContext->GetThreadContext()->NewFunctionNumber();
        if (!sourceInfo->GetSourceContextInfo()->IsDynamic())
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d; Source Url:%s\n"), newFunctionNumber, displayName, sourceInfo->GetSourceInfoId(), sourceInfo->GetCchLength(), sourceInfo->GetSourceContextInfo()->url);
        }
        else
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d;\n"), newFunctionNumber, displayName, sourceInfo->GetSourceInfoId(), sourceInfo->GetCchLength());
        }

        // When generating a new defer parse function, we always use a new function number
        return RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            ParseableFunctionInfo,
            scriptContext->DeferredParsingThunk,
            nestedCount,
            functionId,
            sourceInfo,
            scriptContext,
            newFunctionNumber,
            displayName,
            displayNameLength,
            displayShortNameOffset,
            (FunctionInfo::Attributes)(attributes | FunctionInfo::Attributes::DeferredParse),
            flags);
    }